

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_transverse_3D_K.H
# Opt level: O1

void create_transverse_terms_for_yface
               (int i,int jc,int k,Array4<const_double> *u_ad,Array4<const_double> *w_ad,
               Array4<const_double> *xzlo,Array4<const_double> *zxlo,Array4<const_double> *apx,
               Array4<const_double> *apz,Array4<const_double> *fcx,Array4<const_double> *fcz,
               Real *trans_x,Real *trans_z,Real dx,Real dz)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double dVar59;
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double dVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double local_e8;
  double dStack_e0;
  int ic;
  
  iVar1 = (apx->begin).x;
  lVar27 = (long)jc;
  lVar30 = (lVar27 - (apx->begin).y) * apx->jstride;
  lVar16 = (long)k;
  lVar32 = (lVar16 - (apx->begin).z) * apx->kstride;
  dVar39 = apx->p[lVar30 + (i - iVar1) + lVar32];
  lVar33 = (long)i;
  if ((dVar39 != 1.0) || (NAN(dVar39))) {
    lVar18 = lVar33 - (fcx->begin).x;
    iVar14 = (fcx->begin).y;
    pdVar4 = fcx->p;
    lVar17 = (long)(jc - iVar14) * fcx->jstride;
    iVar15 = (fcx->begin).z;
    lVar19 = (long)(k - iVar15) * fcx->kstride;
    lVar13 = fcx->nstride;
    dVar39 = (pdVar4 + lVar17 + lVar18 + lVar19)[lVar13];
    dVar60 = pdVar4[lVar17 + lVar18 + lVar19];
    dVar48 = -1.0;
    if (0.0 < dVar39) {
      dVar48 = 1.0;
    }
    dVar65 = -1.0;
    if (0.0 < dVar60) {
      dVar65 = 1.0;
    }
    iVar20 = ((0.0 < dVar60) - 1 | 1) + jc;
    lVar23 = lVar33 - (u_ad->begin).x;
    lVar37 = lVar33 - (xzlo->begin).x;
    lVar25 = fcx->jstride * (long)(iVar20 - iVar14);
    iVar14 = (u_ad->begin).y;
    lVar28 = (long)(jc - iVar14) * u_ad->jstride;
    lVar36 = (long)(iVar20 - iVar14) * u_ad->jstride;
    pdVar5 = u_ad->p;
    iVar14 = (xzlo->begin).y;
    lVar24 = (long)(jc - iVar14) * xzlo->jstride;
    lVar35 = (long)(iVar20 - iVar14) * xzlo->jstride;
    pdVar6 = xzlo->p;
    iVar20 = ((0.0 < dVar39) - 1 | 1) + k;
    lVar29 = fcx->kstride * (long)(iVar20 - iVar15);
    iVar14 = (u_ad->begin).z;
    lVar31 = (long)(k - iVar14) * u_ad->kstride;
    iVar15 = (xzlo->begin).z;
    lVar38 = (long)(iVar20 - iVar14) * u_ad->kstride;
    lVar34 = (long)(k - iVar15) * xzlo->kstride;
    lVar26 = (long)(iVar20 - iVar15) * xzlo->kstride;
    dVar41 = pdVar4[lVar17 + lVar18 + lVar29] - dVar60;
    dVar56 = (pdVar4[lVar25 + lVar18 + lVar19] + dVar65) - dVar60;
    dVar59 = (pdVar4[lVar25 + lVar18 + lVar29] + dVar65) - dVar60;
    dVar50 = ((pdVar4 + lVar25 + lVar18 + lVar29)[lVar13] + dVar48) - dVar39;
    dVar51 = ((pdVar4 + lVar17 + lVar18 + lVar29)[lVar13] + dVar48) - dVar39;
    dVar43 = (pdVar4 + lVar25 + lVar18 + lVar19)[lVar13] - dVar39;
    dVar49 = dVar56 * dVar41 * dVar50;
    dVar48 = pdVar6[lVar24 + lVar37 + lVar34];
    dVar65 = pdVar5[lVar28 + lVar23 + lVar31];
    dVar70 = dVar56 * dVar59 * dVar51 * dVar43 +
             (((dVar41 * dVar59 * dVar50 * dVar43 +
               (dVar51 * dVar49 - dVar50 * dVar56 * dVar59 * dVar51)) - dVar49 * dVar43) -
             dVar51 * dVar41 * dVar59 * dVar43);
    dVar60 = 0.0 - dVar60;
    dVar39 = 0.0 - dVar39;
    dVar49 = pdVar6[lVar35 + lVar37 + lVar26] - dVar48;
    dVar74 = pdVar5[lVar36 + lVar23 + lVar38] - dVar65;
    dVar40 = pdVar6[lVar24 + lVar37 + lVar26] - dVar48;
    dVar42 = pdVar5[lVar28 + lVar23 + lVar38] - dVar65;
    dVar45 = pdVar6[lVar35 + lVar37 + lVar34] - dVar48;
    dVar47 = pdVar5[lVar36 + lVar23 + lVar31] - dVar65;
    auVar57._0_8_ =
         (dVar56 - dVar41) * dVar49 * dVar51 * dVar43 +
         (dVar41 - dVar59) * dVar45 * dVar50 * dVar51 + (dVar59 - dVar56) * dVar40 * dVar50 * dVar43
    ;
    auVar57._8_8_ =
         (dVar56 - dVar41) * dVar74 * dVar51 * dVar43 +
         (dVar41 - dVar59) * dVar47 * dVar50 * dVar51 + (dVar59 - dVar56) * dVar42 * dVar50 * dVar43
    ;
    auVar52._0_8_ =
         (dVar43 - dVar50) * dVar56 * dVar59 * dVar40 +
         (dVar50 - dVar51) * dVar41 * dVar45 * dVar59 + (dVar51 - dVar43) * dVar56 * dVar41 * dVar49
    ;
    auVar52._8_8_ =
         (dVar43 - dVar50) * dVar56 * dVar59 * dVar42 +
         (dVar50 - dVar51) * dVar41 * dVar47 * dVar59 + (dVar51 - dVar43) * dVar56 * dVar41 * dVar74
    ;
    auVar66._0_8_ =
         dVar41 * dVar49 * dVar43 +
         (((dVar45 * dVar59 * dVar51 + (dVar40 * dVar56 * dVar50 - dVar41 * dVar45 * dVar50)) -
          dVar56 * dVar49 * dVar51) - dVar59 * dVar40 * dVar43);
    auVar66._8_8_ =
         dVar41 * dVar74 * dVar43 +
         (((dVar47 * dVar59 * dVar51 + (dVar42 * dVar56 * dVar50 - dVar41 * dVar47 * dVar50)) -
          dVar56 * dVar74 * dVar51) - dVar59 * dVar42 * dVar43);
    auVar55._8_8_ = dVar70;
    auVar55._0_8_ = dVar70;
    auVar57 = divpd(auVar57,auVar55);
    auVar64._8_8_ = dVar70;
    auVar64._0_8_ = dVar70;
    auVar55 = divpd(auVar52,auVar64);
    auVar69._8_8_ = dVar70;
    auVar69._0_8_ = dVar70;
    auVar64 = divpd(auVar66,auVar69);
    local_e8 = dVar60 * auVar64._0_8_ * dVar39 +
               auVar55._0_8_ * dVar39 + auVar57._0_8_ * dVar60 + dVar48;
    dStack_e0 = dVar60 * auVar64._8_8_ * dVar39 +
                auVar55._8_8_ * dVar39 + auVar57._8_8_ * dVar60 + dVar65;
  }
  else {
    local_e8 = xzlo->p[(lVar27 - (xzlo->begin).y) * xzlo->jstride +
                       (lVar33 - (xzlo->begin).x) + (lVar16 - (xzlo->begin).z) * xzlo->kstride];
    dStack_e0 = u_ad->p[(lVar27 - (u_ad->begin).y) * u_ad->jstride +
                        (lVar33 - (u_ad->begin).x) + (lVar16 - (u_ad->begin).z) * u_ad->kstride];
  }
  iVar14 = (int)(lVar33 + 1);
  dVar39 = apx->p[lVar30 + (iVar14 - iVar1) + lVar32];
  if ((dVar39 != 1.0) || (NAN(dVar39))) {
    lVar13 = (long)iVar14;
    lVar18 = lVar13 - (fcx->begin).x;
    iVar1 = (fcx->begin).y;
    pdVar4 = fcx->p;
    lVar32 = (long)(jc - iVar1) * fcx->jstride;
    iVar15 = (fcx->begin).z;
    lVar17 = (long)(k - iVar15) * fcx->kstride;
    lVar30 = fcx->nstride;
    dVar39 = (pdVar4 + lVar32 + lVar18 + lVar17)[lVar30];
    dVar60 = pdVar4[lVar32 + lVar18 + lVar17];
    dVar48 = -1.0;
    if (0.0 < dVar39) {
      dVar48 = 1.0;
    }
    dVar65 = -1.0;
    if (0.0 < dVar60) {
      dVar65 = 1.0;
    }
    lVar35 = lVar13 - (u_ad->begin).x;
    lVar13 = lVar13 - (xzlo->begin).x;
    iVar20 = ((0.0 < dVar60) - 1 | 1) + jc;
    lVar36 = fcx->jstride * (long)(iVar20 - iVar1);
    iVar1 = (u_ad->begin).y;
    lVar25 = (long)(jc - iVar1) * u_ad->jstride;
    lVar34 = (long)(iVar20 - iVar1) * u_ad->jstride;
    pdVar5 = u_ad->p;
    iVar1 = (xzlo->begin).y;
    lVar19 = (long)(jc - iVar1) * xzlo->jstride;
    lVar31 = (long)(iVar20 - iVar1) * xzlo->jstride;
    pdVar6 = xzlo->p;
    iVar20 = ((0.0 < dVar39) - 1 | 1) + k;
    lVar26 = fcx->kstride * (long)(iVar20 - iVar15);
    iVar1 = (u_ad->begin).z;
    lVar29 = (long)(k - iVar1) * u_ad->kstride;
    iVar15 = (xzlo->begin).z;
    lVar24 = (long)(iVar20 - iVar1) * u_ad->kstride;
    lVar28 = (long)(k - iVar15) * xzlo->kstride;
    lVar23 = (long)(iVar20 - iVar15) * xzlo->kstride;
    dVar74 = pdVar4[lVar32 + lVar18 + lVar26] - dVar60;
    dVar41 = (pdVar4[lVar36 + lVar18 + lVar17] + dVar65) - dVar60;
    dVar45 = (pdVar4[lVar36 + lVar18 + lVar26] + dVar65) - dVar60;
    dVar40 = ((pdVar4 + lVar36 + lVar18 + lVar26)[lVar30] + dVar48) - dVar39;
    dVar42 = ((pdVar4 + lVar32 + lVar18 + lVar26)[lVar30] + dVar48) - dVar39;
    dVar47 = (pdVar4 + lVar36 + lVar18 + lVar17)[lVar30] - dVar39;
    dVar49 = dVar41 * dVar74 * dVar40;
    dVar48 = pdVar6[lVar19 + lVar13 + lVar28];
    dVar65 = pdVar5[lVar25 + lVar35 + lVar29];
    dVar70 = dVar41 * dVar45 * dVar42 * dVar47 +
             (((dVar74 * dVar45 * dVar40 * dVar47 +
               (dVar42 * dVar49 - dVar40 * dVar41 * dVar45 * dVar42)) - dVar49 * dVar47) -
             dVar42 * dVar74 * dVar45 * dVar47);
    dVar60 = 0.0 - dVar60;
    dVar39 = 0.0 - dVar39;
    dVar50 = pdVar6[lVar31 + lVar13 + lVar23] - dVar48;
    dVar51 = pdVar5[lVar34 + lVar35 + lVar24] - dVar65;
    dVar56 = pdVar6[lVar19 + lVar13 + lVar23] - dVar48;
    dVar59 = pdVar5[lVar25 + lVar35 + lVar24] - dVar65;
    dVar49 = pdVar6[lVar31 + lVar13 + lVar28] - dVar48;
    dVar43 = pdVar5[lVar34 + lVar35 + lVar29] - dVar65;
    auVar61._0_8_ =
         (dVar41 - dVar74) * dVar50 * dVar42 * dVar47 +
         (dVar74 - dVar45) * dVar49 * dVar40 * dVar42 + (dVar45 - dVar41) * dVar56 * dVar40 * dVar47
    ;
    auVar61._8_8_ =
         (dVar41 - dVar74) * dVar51 * dVar42 * dVar47 +
         (dVar74 - dVar45) * dVar43 * dVar40 * dVar42 + (dVar45 - dVar41) * dVar59 * dVar40 * dVar47
    ;
    auVar53._0_8_ =
         (dVar47 - dVar40) * dVar41 * dVar45 * dVar56 +
         (dVar40 - dVar42) * dVar74 * dVar49 * dVar45 + (dVar42 - dVar47) * dVar41 * dVar74 * dVar50
    ;
    auVar53._8_8_ =
         (dVar47 - dVar40) * dVar41 * dVar45 * dVar59 +
         (dVar40 - dVar42) * dVar74 * dVar43 * dVar45 + (dVar42 - dVar47) * dVar41 * dVar74 * dVar51
    ;
    auVar44._0_8_ =
         dVar74 * dVar50 * dVar47 +
         (((dVar49 * dVar45 * dVar42 + (dVar56 * dVar41 * dVar40 - dVar74 * dVar49 * dVar40)) -
          dVar41 * dVar50 * dVar42) - dVar45 * dVar56 * dVar47);
    auVar44._8_8_ =
         dVar74 * dVar51 * dVar47 +
         (((dVar43 * dVar45 * dVar42 + (dVar59 * dVar41 * dVar40 - dVar74 * dVar43 * dVar40)) -
          dVar41 * dVar51 * dVar42) - dVar45 * dVar59 * dVar47);
    auVar7._8_8_ = dVar70;
    auVar7._0_8_ = dVar70;
    auVar69 = divpd(auVar61,auVar7);
    auVar8._8_8_ = dVar70;
    auVar8._0_8_ = dVar70;
    auVar64 = divpd(auVar53,auVar8);
    auVar9._8_8_ = dVar70;
    auVar9._0_8_ = dVar70;
    auVar55 = divpd(auVar44,auVar9);
    dVar48 = dVar60 * auVar55._0_8_ * dVar39 +
             auVar64._0_8_ * dVar39 + auVar69._0_8_ * dVar60 + dVar48;
    dVar39 = dVar60 * auVar55._8_8_ * dVar39 +
             auVar64._8_8_ * dVar39 + auVar69._8_8_ * dVar60 + dVar65;
  }
  else {
    dVar48 = xzlo->p[(lVar27 - (xzlo->begin).y) * xzlo->jstride +
                     ((long)iVar14 - (long)(xzlo->begin).x) +
                     (lVar16 - (xzlo->begin).z) * xzlo->kstride];
    dVar39 = u_ad->p[(lVar27 - (u_ad->begin).y) * u_ad->jstride +
                     ((lVar33 + 1) - (long)(u_ad->begin).x) +
                     (lVar16 - (u_ad->begin).z) * u_ad->kstride];
  }
  lVar30 = lVar33 - (apz->begin).x;
  lVar32 = (lVar27 - (apz->begin).y) * apz->jstride;
  iVar1 = (apz->begin).z;
  dVar60 = apz->p[lVar32 + lVar30 + (long)(k - iVar1) * apz->kstride];
  if ((dVar60 != 1.0) || (NAN(dVar60))) {
    iVar15 = (fcz->begin).x;
    lVar18 = (long)(i - iVar15);
    iVar20 = (fcz->begin).y;
    pdVar4 = fcz->p;
    lVar17 = (long)(jc - iVar20) * fcz->jstride;
    lVar19 = (lVar16 - (fcz->begin).z) * fcz->kstride;
    lVar13 = fcz->nstride;
    dVar60 = (pdVar4 + lVar17 + lVar18 + lVar19)[lVar13];
    dVar65 = pdVar4[lVar17 + lVar18 + lVar19];
    dVar49 = -1.0;
    if (0.0 < dVar60) {
      dVar49 = 1.0;
    }
    iVar22 = i + -1;
    if (0.0 < dVar65) {
      iVar22 = iVar14;
    }
    iVar2 = (w_ad->begin).x;
    iVar3 = (zxlo->begin).x;
    iVar21 = ((0.0 < dVar60) - 1 | 1) + jc;
    lVar37 = fcz->jstride * (long)(iVar21 - iVar20);
    lVar38 = (long)(i - iVar2);
    lVar24 = (long)(iVar22 - iVar15);
    iVar15 = (w_ad->begin).y;
    pdVar5 = w_ad->p;
    lVar28 = (long)(jc - iVar15) * w_ad->jstride;
    lVar36 = (long)(iVar21 - iVar15) * w_ad->jstride;
    iVar15 = (zxlo->begin).y;
    lVar29 = (long)(jc - iVar15) * zxlo->jstride;
    lVar31 = (long)(iVar21 - iVar15) * zxlo->jstride;
    pdVar6 = zxlo->p;
    lVar23 = (long)(i - iVar3);
    lVar35 = (long)(iVar22 - iVar2);
    lVar25 = (long)(iVar22 - iVar3);
    lVar26 = (lVar16 - (w_ad->begin).z) * w_ad->kstride;
    lVar34 = (lVar16 - (zxlo->begin).z) * zxlo->kstride;
    dVar74 = pdVar6[lVar29 + lVar23 + lVar34];
    dVar43 = pdVar5[lVar28 + lVar38 + lVar26];
    dVar40 = (double)(~-(ulong)(dVar65 <= 0.0) & 0x3ff0000000000000 |
                     -(ulong)(dVar65 <= 0.0) & 0xbff0000000000000);
    dVar71 = pdVar4[lVar37 + lVar18 + lVar19] - dVar65;
    dVar59 = (pdVar4[lVar17 + lVar24 + lVar19] + dVar40) - dVar65;
    dVar70 = (pdVar4[lVar37 + lVar24 + lVar19] + dVar40) - dVar65;
    dVar42 = ((pdVar4 + lVar37 + lVar24 + lVar19)[lVar13] + dVar49) - dVar60;
    dVar41 = ((pdVar4 + lVar37 + lVar18 + lVar19)[lVar13] + dVar49) - dVar60;
    dVar56 = (pdVar4 + lVar17 + lVar24 + lVar19)[lVar13] - dVar60;
    dVar49 = dVar59 * dVar71 * dVar42;
    auVar58._0_8_ =
         dVar59 * dVar70 * dVar41 * dVar56 +
         (((dVar71 * dVar70 * dVar42 * dVar56 +
           (dVar41 * dVar49 - dVar42 * dVar59 * dVar70 * dVar41)) - dVar49 * dVar56) -
         dVar41 * dVar71 * dVar70 * dVar56);
    dVar65 = 0.0 - dVar65;
    dVar60 = 0.0 - dVar60;
    dVar49 = pdVar6[lVar31 + lVar25 + lVar34] - dVar74;
    dVar40 = pdVar5[lVar36 + lVar35 + lVar26] - dVar43;
    dVar45 = pdVar6[lVar31 + lVar23 + lVar34] - dVar74;
    dVar47 = pdVar5[lVar36 + lVar38 + lVar26] - dVar43;
    dVar50 = pdVar6[lVar29 + lVar25 + lVar34] - dVar74;
    dVar51 = pdVar5[lVar28 + lVar35 + lVar26] - dVar43;
    auVar67._0_8_ =
         (dVar59 - dVar71) * dVar49 * dVar41 * dVar56 +
         (dVar71 - dVar70) * dVar50 * dVar42 * dVar41 + (dVar70 - dVar59) * dVar45 * dVar42 * dVar56
    ;
    auVar67._8_8_ =
         (dVar59 - dVar71) * dVar40 * dVar41 * dVar56 +
         (dVar71 - dVar70) * dVar51 * dVar42 * dVar41 + (dVar70 - dVar59) * dVar47 * dVar42 * dVar56
    ;
    auVar62._0_8_ =
         (dVar56 - dVar42) * dVar59 * dVar70 * dVar45 +
         (dVar42 - dVar41) * dVar71 * dVar50 * dVar70 + (dVar41 - dVar56) * dVar59 * dVar71 * dVar49
    ;
    auVar62._8_8_ =
         (dVar56 - dVar42) * dVar59 * dVar70 * dVar47 +
         (dVar42 - dVar41) * dVar71 * dVar51 * dVar70 + (dVar41 - dVar56) * dVar59 * dVar71 * dVar40
    ;
    auVar46._0_8_ =
         dVar71 * dVar49 * dVar56 +
         (((dVar50 * dVar70 * dVar41 + (dVar45 * dVar59 * dVar42 - dVar71 * dVar50 * dVar42)) -
          dVar59 * dVar49 * dVar41) - dVar70 * dVar45 * dVar56);
    auVar46._8_8_ =
         dVar71 * dVar40 * dVar56 +
         (((dVar51 * dVar70 * dVar41 + (dVar47 * dVar59 * dVar42 - dVar71 * dVar51 * dVar42)) -
          dVar59 * dVar40 * dVar41) - dVar70 * dVar47 * dVar56);
    auVar58._8_8_ = auVar58._0_8_;
    auVar69 = divpd(auVar67,auVar58);
    auVar64 = divpd(auVar62,auVar58);
    auVar55 = divpd(auVar46,auVar58);
    dVar49 = dVar65 * auVar55._0_8_ * dVar60 +
             auVar64._0_8_ * dVar60 + auVar69._0_8_ * dVar65 + dVar74;
    dVar60 = dVar65 * auVar55._8_8_ * dVar60 +
             auVar64._8_8_ * dVar60 + auVar69._8_8_ * dVar65 + dVar43;
  }
  else {
    dVar49 = zxlo->p[(lVar27 - (zxlo->begin).y) * zxlo->jstride +
                     (lVar33 - (zxlo->begin).x) + (lVar16 - (zxlo->begin).z) * zxlo->kstride];
    dVar60 = w_ad->p[(lVar27 - (w_ad->begin).y) * w_ad->jstride +
                     (lVar33 - (w_ad->begin).x) + (lVar16 - (w_ad->begin).z) * w_ad->kstride];
  }
  iVar15 = (int)(lVar16 + 1);
  dVar65 = apz->p[lVar32 + lVar30 + apz->kstride * (long)(iVar15 - iVar1)];
  if ((dVar65 != 1.0) || (NAN(dVar65))) {
    iVar1 = (fcz->begin).x;
    lVar30 = (long)(i - iVar1);
    iVar20 = (fcz->begin).y;
    pdVar4 = fcz->p;
    lVar27 = (long)(jc - iVar20) * fcz->jstride;
    lVar33 = (long)iVar15;
    lVar32 = (lVar33 - (fcz->begin).z) * fcz->kstride;
    lVar16 = fcz->nstride;
    dVar65 = (pdVar4 + lVar27 + lVar30 + lVar32)[lVar16];
    dVar74 = pdVar4[lVar27 + lVar30 + lVar32];
    dVar43 = -1.0;
    if (0.0 < dVar65) {
      dVar43 = 1.0;
    }
    iVar15 = i + -1;
    if (0.0 < dVar74) {
      iVar15 = iVar14;
    }
    iVar14 = (w_ad->begin).x;
    iVar22 = ((0.0 < dVar65) - 1 | 1) + jc;
    lVar31 = fcz->jstride * (long)(iVar22 - iVar20);
    lVar13 = (long)(iVar15 - iVar1);
    iVar1 = (w_ad->begin).y;
    iVar20 = (zxlo->begin).x;
    lVar26 = (long)(jc - iVar1) * w_ad->jstride;
    lVar17 = (lVar33 - (w_ad->begin).z) * w_ad->kstride;
    lVar29 = (long)(iVar22 - iVar1) * w_ad->jstride;
    pdVar5 = w_ad->p;
    iVar1 = (zxlo->begin).y;
    lVar18 = (long)(jc - iVar1) * zxlo->jstride;
    lVar23 = (long)(iVar22 - iVar1) * zxlo->jstride;
    lVar35 = (long)(i - iVar14);
    lVar33 = (lVar33 - (zxlo->begin).z) * zxlo->kstride;
    pdVar6 = zxlo->p;
    lVar19 = (long)(i - iVar20);
    lVar24 = (long)(iVar15 - iVar14);
    lVar36 = (long)(iVar15 - iVar20);
    dVar40 = pdVar6[lVar18 + lVar19 + lVar33];
    dVar42 = pdVar5[lVar26 + lVar35 + lVar17];
    dVar41 = (double)(~-(ulong)(dVar74 <= 0.0) & 0x3ff0000000000000 |
                     -(ulong)(dVar74 <= 0.0) & 0xbff0000000000000);
    dVar73 = pdVar4[lVar31 + lVar30 + lVar32] - dVar74;
    dVar56 = (pdVar4[lVar27 + lVar13 + lVar32] + dVar41) - dVar74;
    dVar59 = (pdVar4[lVar31 + lVar13 + lVar32] + dVar41) - dVar74;
    dVar71 = ((pdVar4 + lVar31 + lVar13 + lVar32)[lVar16] + dVar43) - dVar65;
    dVar72 = ((pdVar4 + lVar31 + lVar30 + lVar32)[lVar16] + dVar43) - dVar65;
    dVar70 = (pdVar4 + lVar27 + lVar13 + lVar32)[lVar16] - dVar65;
    dVar43 = dVar56 * dVar73 * dVar71;
    dVar75 = dVar56 * dVar59 * dVar72 * dVar70 +
             (((dVar73 * dVar59 * dVar71 * dVar70 +
               (dVar72 * dVar43 - dVar71 * dVar56 * dVar59 * dVar72)) - dVar43 * dVar70) -
             dVar72 * dVar73 * dVar59 * dVar70);
    dVar74 = 0.0 - dVar74;
    dVar65 = 0.0 - dVar65;
    dVar43 = pdVar6[lVar23 + lVar36 + lVar33] - dVar40;
    dVar41 = pdVar5[lVar29 + lVar24 + lVar17] - dVar42;
    dVar45 = pdVar6[lVar23 + lVar19 + lVar33] - dVar40;
    dVar47 = pdVar5[lVar29 + lVar35 + lVar17] - dVar42;
    dVar50 = pdVar6[lVar18 + lVar36 + lVar33] - dVar40;
    dVar51 = pdVar5[lVar26 + lVar24 + lVar17] - dVar42;
    auVar68._0_8_ =
         (dVar56 - dVar73) * dVar43 * dVar72 * dVar70 +
         (dVar73 - dVar59) * dVar50 * dVar71 * dVar72 + (dVar59 - dVar56) * dVar45 * dVar71 * dVar70
    ;
    auVar68._8_8_ =
         (dVar56 - dVar73) * dVar41 * dVar72 * dVar70 +
         (dVar73 - dVar59) * dVar51 * dVar71 * dVar72 + (dVar59 - dVar56) * dVar47 * dVar71 * dVar70
    ;
    auVar63._0_8_ =
         (dVar70 - dVar71) * dVar56 * dVar59 * dVar45 +
         (dVar71 - dVar72) * dVar73 * dVar50 * dVar59 + (dVar72 - dVar70) * dVar56 * dVar73 * dVar43
    ;
    auVar63._8_8_ =
         (dVar70 - dVar71) * dVar56 * dVar59 * dVar47 +
         (dVar71 - dVar72) * dVar73 * dVar51 * dVar59 + (dVar72 - dVar70) * dVar56 * dVar73 * dVar41
    ;
    auVar54._0_8_ =
         dVar73 * dVar43 * dVar70 +
         (((dVar50 * dVar59 * dVar72 + (dVar45 * dVar56 * dVar71 - dVar73 * dVar50 * dVar71)) -
          dVar56 * dVar43 * dVar72) - dVar59 * dVar45 * dVar70);
    auVar54._8_8_ =
         dVar73 * dVar41 * dVar70 +
         (((dVar51 * dVar59 * dVar72 + (dVar47 * dVar56 * dVar71 - dVar73 * dVar51 * dVar71)) -
          dVar56 * dVar41 * dVar72) - dVar59 * dVar47 * dVar70);
    auVar10._8_8_ = dVar75;
    auVar10._0_8_ = dVar75;
    auVar69 = divpd(auVar68,auVar10);
    auVar11._8_8_ = dVar75;
    auVar11._0_8_ = dVar75;
    auVar64 = divpd(auVar63,auVar11);
    auVar12._8_8_ = dVar75;
    auVar12._0_8_ = dVar75;
    auVar55 = divpd(auVar54,auVar12);
    dVar43 = dVar74 * auVar55._0_8_ * dVar65 +
             auVar64._0_8_ * dVar65 + auVar69._0_8_ * dVar74 + dVar40;
    dVar65 = dVar74 * auVar55._8_8_ * dVar65 +
             auVar64._8_8_ * dVar65 + auVar69._8_8_ * dVar74 + dVar42;
  }
  else {
    dVar43 = zxlo->p[(lVar27 - (zxlo->begin).y) * zxlo->jstride +
                     (lVar33 - (zxlo->begin).x) +
                     ((long)iVar15 - (long)(zxlo->begin).z) * zxlo->kstride];
    dVar65 = w_ad->p[(lVar27 - (w_ad->begin).y) * w_ad->jstride +
                     (lVar33 - (w_ad->begin).x) +
                     ((lVar16 + 1) - (long)(w_ad->begin).z) * w_ad->kstride];
  }
  *trans_x = ((dVar48 - local_e8) * (dVar39 + dStack_e0) * 0.5) / dx;
  *trans_z = ((dVar43 - dVar49) * (dVar65 + dVar60) * 0.5) / dz;
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE AMREX_INLINE
void create_transverse_terms_for_yface(int i, int jc, int k,
                                       Array4<Real const> const& u_ad,
                                       Array4<Real const> const& w_ad,
                                       Array4<Real const> const& xzlo,
                                       Array4<Real const> const& zxlo,
                                       Array4<Real const> const& apx,
                                       Array4<Real const> const& apz,
                                       Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcz,
                                       Real& trans_x, Real& trans_z,
                                       const Real dx, const Real dz)
{
    Real u_tmp_i, u_tmp_ip1;
    Real w_tmp_k, w_tmp_kp1;
    Real x_hat_i, x_hat_ip1;
    Real z_hat_k, z_hat_kp1;

    // Tangential extrapolation in the y- and z-directions at i-1/2
    if (apx(i,jc,k) == 1.0)
    {
        u_tmp_i = u_ad(i,jc,k);
        x_hat_i = xzlo(i,jc,k);

    } else {

        int ic = i;
        int kc = k;

        int jj = (fcx(ic,jc,kc,0) <= 0.0) ? jc-1 : jc+1;
        int kk = (fcx(ic,jc,kc,1) <= 0.0) ? kc-1 : kc+1;

        Real yoff = (fcx(ic,jc,kc,0) <= 0.0) ? -1. : 1.;
        Real zoff = (fcx(ic,jc,kc,1) <= 0.0) ? -1. : 1.;

        Real y0 =  fcx(ic,jc,kc,0);
        Real z0 =  fcx(ic,jc,kc,1);
        Real v0 = u_ad(ic,jc,kc  ); Real h0 = xzlo(ic,jc,kc);

        Real y1 =  fcx(ic,jj,kc,0)+yoff;
        Real z1 =  fcx(ic,jj,kc,1);
        Real v1 = u_ad(ic,jj,kc  ); Real h1 = xzlo(ic,jj,kc);

        Real y2 =  fcx(ic,jc,kk,0);
        Real z2 =  fcx(ic,jc,kk,1)+zoff;
        Real v2 = u_ad(ic,jc,kk  ); Real h2 = xzlo(ic,jc,kk);

        Real y3 =  fcx(ic,jj,kk,0)+yoff;
        Real z3 =  fcx(ic,jj,kk,1)+zoff;
        Real v3 = u_ad(ic,jj,kk  ); Real h3 = xzlo(ic,jj,kk);

        u_tmp_i = EB_interp_in_quad(0.,0.,v0,v1,v2,v3,y0,z0,y1,z1,y2,z2,y3,z3);
        x_hat_i = EB_interp_in_quad(0.,0.,h0,h1,h2,h3,y0,z0,y1,z1,y2,z2,y3,z3);
    }

    // Tangential extrapolation in the y- and z-directions at i+1/2
    if (apx(i+1,jc,k) == 1.0)
    {
        u_tmp_ip1 = u_ad(i+1,jc,k);
        x_hat_ip1 = xzlo(i+1,jc,k);

    } else {

        int ic = i+1;
        int kc = k;

        int jj = (fcx(ic,jc,kc,0) <= 0.0) ? jc-1 : jc+1;
        int kk = (fcx(ic,jc,kc,1) <= 0.0) ? kc-1 : kc+1;

        Real yoff = (fcx(ic,jc,kc,0) <= 0.0) ? -1. : 1.;
        Real zoff = (fcx(ic,jc,kc,1) <= 0.0) ? -1. : 1.;

        Real y0 =  fcx(ic,jc,kc,0);
        Real z0 =  fcx(ic,jc,kc,1);
        Real v0 = u_ad(ic,jc,kc  ); Real h0 = xzlo(ic,jc,kc);

        Real y1 =  fcx(ic,jj,kc,0)+yoff;
        Real z1 =  fcx(ic,jj,kc,1);
        Real v1 = u_ad(ic,jj,kc  ); Real h1 = xzlo(ic,jj,kc);

        Real y2 =  fcx(ic,jc,kk,0);
        Real z2 =  fcx(ic,jc,kk,1)+zoff;
        Real v2 = u_ad(ic,jc,kk  ); Real h2 = xzlo(ic,jc,kk);

        Real y3 =  fcx(ic,jj,kk,0)+yoff;
        Real z3 =  fcx(ic,jj,kk,1)+zoff;
        Real v3 = u_ad(ic,jj,kk  ); Real h3 = xzlo(ic,jj,kk);

        u_tmp_ip1 = EB_interp_in_quad(0.,0.,v0,v1,v2,v3,y0,z0,y1,z1,y2,z2,y3,z3);
        x_hat_ip1 = EB_interp_in_quad(0.,0.,h0,h1,h2,h3,y0,z0,y1,z1,y2,z2,y3,z3);
    }

    // Tangential extrapolation in the x- and y-directions at k-1/2
    if (apz(i,jc,k) == 1.0)
    {
        w_tmp_k = w_ad(i,jc,k);
        z_hat_k = zxlo(i,jc,k);

    } else {

        int ic = i;
        int kc = k;

        int ii = (fcz(ic,jc,kc,0) <= 0.0) ? ic-1 : ic+1;
        int jj = (fcz(ic,jc,kc,1) <= 0.0) ? jc-1 : jc+1;

        Real xoff = (fcz(ic,jc,kc,0) <= 0.0) ? -1. : 1.;
        Real yoff = (fcz(ic,jc,kc,1) <= 0.0) ? -1. : 1.;

        Real x0 =  fcz(ic,jc,kc,0);
        Real y0 =  fcz(ic,jc,kc,1);
        Real v0 = w_ad(ic,jc,kc  ); Real h0 = zxlo(ic,jc,kc);

        Real x1 =  fcz(ii,jc,kc,0)+xoff;
        Real y1 =  fcz(ii,jc,kc,1);
        Real v1 = w_ad(ii,jc,kc  ); Real h1 = zxlo(ii,jc,kc);

        Real x2 =  fcz(ic,jj,kc,0);
        Real y2 =  fcz(ic,jj,kc,1)+yoff;
        Real v2 = w_ad(ic,jj,kc  ); Real h2 = zxlo(ic,jj,kc);

        Real x3 =  fcz(ii,jj,kc,0)+xoff;
        Real y3 =  fcz(ii,jj,kc,1)+yoff;
        Real v3 = w_ad(ii,jj,kc  ); Real h3 = zxlo(ii,jj,kc);

        w_tmp_k = EB_interp_in_quad(0.,0.,v0,v1,v2,v3,x0,y0,x1,y1,x2,y2,x3,y3);
        z_hat_k = EB_interp_in_quad(0.,0.,h0,h1,h2,h3,x0,y0,x1,y1,x2,y2,x3,y3);
    }

    // Tangential extrapolation in the x- and y-directions at k+1/2
    if (apz(i,jc,k+1) == 1.0)
    {
        w_tmp_kp1 = w_ad(i,jc,k+1);
        z_hat_kp1 = zxlo(i,jc,k+1);

    } else {

        int ic = i;
        int kc = k+1;

        int ii = (fcz(ic,jc,kc,0) <= 0.0) ? ic-1 : ic+1;
        int jj = (fcz(ic,jc,kc,1) <= 0.0) ? jc-1 : jc+1;

        Real xoff = (fcz(ic,jc,kc,0) <= 0.0) ? -1. : 1.;
        Real yoff = (fcz(ic,jc,kc,1) <= 0.0) ? -1. : 1.;

        Real x0 =  fcz(ic,jc,kc,0);
        Real y0 =  fcz(ic,jc,kc,1);
        Real v0 = w_ad(ic,jc,kc  ); Real h0 = zxlo(ic,jc,kc);

        Real x1 =  fcz(ii,jc,kc,0)+xoff;
        Real y1 =  fcz(ii,jc,kc,1);
        Real v1 = w_ad(ii,jc,kc  ); Real h1 = zxlo(ii,jc,kc);

        Real x2 =  fcz(ic,jj,kc,0);
        Real y2 =  fcz(ic,jj,kc,1)+yoff;
        Real v2 = w_ad(ic,jj,kc  ); Real h2 = zxlo(ic,jj,kc);

        Real x3 =  fcz(ii,jj,kc,0)+xoff;
        Real y3 =  fcz(ii,jj,kc,1)+yoff;
        Real v3 = w_ad(ii,jj,kc  ); Real h3 = zxlo(ii,jj,kc);

        w_tmp_kp1 = EB_interp_in_quad(0.,0.,v0,v1,v2,v3,x0,y0,x1,y1,x2,y2,x3,y3);
        z_hat_kp1 = EB_interp_in_quad(0.,0.,h0,h1,h2,h3,x0,y0,x1,y1,x2,y2,x3,y3);
    }

    Real u_tmp_l = 0.5 * (u_tmp_ip1 + u_tmp_i);
    Real  dudx_l =       (x_hat_ip1 - x_hat_i);

    Real w_tmp_l = 0.5 * (w_tmp_kp1 + w_tmp_k);
    Real  dudz_l =       (z_hat_kp1 - z_hat_k);

    trans_x = u_tmp_l * dudx_l / dx;
    trans_z = w_tmp_l * dudz_l / dz;
}